

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowValueGlobalState::Finalize(WindowValueGlobalState *this,CollectionPtr collection)

{
  int iVar1;
  reference pvVar2;
  optional_ptr<duckdb::WindowCollection,_true> local_18;
  
  local_18.ptr = collection.ptr;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar1 == 0) {
    if ((this->child_idx != 0xffffffffffffffff) &&
       (((this->super_WindowExecutorGlobalState).executor)->wexpr->ignore_nulls == true)) {
      optional_ptr<duckdb::WindowCollection,_true>::CheckValid(&local_18);
      pvVar2 = vector<duckdb::ValidityMask,_true>::operator[]
                         (&(local_18.ptr)->validities,this->child_idx);
      (this->ignore_nulls).ptr = pvVar2;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void Finalize(CollectionPtr collection) {
		lock_guard<mutex> ignore_nulls_guard(lock);
		if (child_idx != DConstants::INVALID_INDEX && executor.wexpr.ignore_nulls) {
			ignore_nulls = &collection->validities[child_idx];
		}
	}